

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void Lowerer::InsertDecUInt32PreventOverflow
               (Opnd *dst,Opnd *src,Instr *insertBeforeInstr,Instr **onOverflowInsertBeforeInstrRef)

{
  Func *func_00;
  code *pcVar1;
  undefined8 dst_00;
  bool bVar2;
  IRType IVar3;
  undefined4 *puVar4;
  LabelInstr *target;
  StackSym *sym;
  IntConstOpnd *pIVar5;
  LabelInstr *target_00;
  LabelInstr *continueLabel;
  bool dstEqualsSrc;
  undefined1 local_58 [8];
  AutoReuseOpnd autoReuseTempOpnd;
  RegOpnd *tempOpnd;
  LabelInstr *overflowLabel;
  Func *func;
  Instr **onOverflowInsertBeforeInstrRef_local;
  Instr *insertBeforeInstr_local;
  Opnd *src_local;
  Opnd *dst_local;
  
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3f6e,"(dst)","dst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IVar3 = IR::Opnd::GetType(dst);
  if (IVar3 != TyUint32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3f6f,"(dst->GetType() == TyUint32)","dst->GetType() == TyUint32");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3f70,"(src)","src");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IVar3 = IR::Opnd::GetType(src);
  if (IVar3 != TyUint32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3f71,"(src->GetType() == TyUint32)","src->GetType() == TyUint32");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr();
    *puVar4 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3f72,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr();
    *puVar4 = 0;
  }
  func_00 = insertBeforeInstr->m_func;
  target = InsertLabel(false,insertBeforeInstr);
  sym = StackSym::New(TyUint32,func_00);
  autoReuseTempOpnd._16_8_ = IR::RegOpnd::New(sym,TyUint32,func_00);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_58,(Opnd *)autoReuseTempOpnd._16_8_,func_00,true);
  dst_00 = autoReuseTempOpnd._16_8_;
  pIVar5 = IR::IntConstOpnd::New(1,TyUint32,func_00,true);
  InsertSub(true,(Opnd *)dst_00,src,&pIVar5->super_Opnd,&target->super_Instr);
  InsertBranch(BrLt_A,true,target,&target->super_Instr);
  InsertMove(dst,(Opnd *)autoReuseTempOpnd._16_8_,&target->super_Instr,true);
  bVar2 = IR::Opnd::IsEqual(dst,src);
  if ((!bVar2) || (onOverflowInsertBeforeInstrRef != (Instr **)0x0)) {
    target_00 = InsertLabel(false,insertBeforeInstr);
    InsertBranch(Br,target_00,&target->super_Instr);
    if (!bVar2) {
      pIVar5 = IR::IntConstOpnd::New(0,TyUint32,func_00,true);
      InsertMove(dst,&pIVar5->super_Opnd,&target_00->super_Instr,true);
    }
    if (onOverflowInsertBeforeInstrRef != (Instr **)0x0) {
      *onOverflowInsertBeforeInstrRef = &target_00->super_Instr;
    }
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_58);
  return;
}

Assistant:

void Lowerer::InsertDecUInt32PreventOverflow(
    IR::Opnd *const dst,
    IR::Opnd *const src,
    IR::Instr *const insertBeforeInstr,
    IR::Instr * *const onOverflowInsertBeforeInstrRef)
{
    Assert(dst);
    Assert(dst->GetType() == TyUint32);
    Assert(src);
    Assert(src->GetType() == TyUint32);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    // Generate:
    //     subs temp, src, 1
    //     bcs $overflow
    //     mov dst, temp
    //     b $continue
    //   $overflow:
    //     mov dst, 0
    //   $continue:

    IR::LabelInstr *const overflowLabel = Lowerer::InsertLabel(false, insertBeforeInstr);

    //     subs temp, src, 1
    IR::RegOpnd *const tempOpnd = IR::RegOpnd::New(StackSym::New(TyUint32, func), TyUint32, func);
    const IR::AutoReuseOpnd autoReuseTempOpnd(tempOpnd, func);
    Lowerer::InsertSub(true, tempOpnd, src, IR::IntConstOpnd::New(1, TyUint32, func, true), overflowLabel);

    //     bcs $overflow
    Lowerer::InsertBranch(Js::OpCode::BrLt_A, true, overflowLabel, overflowLabel);

    //     mov dst, temp
    Lowerer::InsertMove(dst, tempOpnd, overflowLabel);

    const bool dstEqualsSrc = dst->IsEqual(src);
    if(!dstEqualsSrc || onOverflowInsertBeforeInstrRef)
    {
        //     b $continue
        //   $overflow:
        //     mov dst, 0
        //   $continue:
        IR::LabelInstr *const continueLabel = Lowerer::InsertLabel(false, insertBeforeInstr);
        Lowerer::InsertBranch(Js::OpCode::Br, continueLabel, overflowLabel);
        if(!dstEqualsSrc)
        {
            Lowerer::InsertMove(dst, IR::IntConstOpnd::New(0, TyUint32, func, true), continueLabel);
        }

        if(onOverflowInsertBeforeInstrRef)
        {
            *onOverflowInsertBeforeInstrRef = continueLabel;
        }
    }
    else
    {
        //   $overflow:
    }
}